

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# decode.cpp
# Opt level: O2

BrotliDecoderErrorCode
duckdb_brotli::DecodeContextMap
          (uint64_t context_map_size,uint64_t *num_htrees,uint8_t **context_map_arg,
          BrotliDecoderStateInternal *s)

{
  ulong uVar1;
  byte *pbVar2;
  BrotliDecoderErrorCode BVar3;
  int iVar4;
  uint8_t *puVar5;
  ulong uVar6;
  ulong uVar7;
  ulong uVar8;
  ulong uVar9;
  size_t __n;
  BrotliBitReader *br;
  HuffmanCode *pHVar10;
  uint64_t uVar11;
  BrotliRunningContextMapState BVar12;
  uint64_t uVar13;
  bool bVar14;
  uint64_t code;
  HuffmanCode *local_48;
  uint8_t **local_40;
  BrotliBitReader *local_38;
  
  BVar12 = (s->arena).header.substate_context_map;
  if (BROTLI_STATE_CONTEXT_MAP_TRANSFORM < BVar12) {
    return BROTLI_DECODER_ERROR_UNREACHABLE;
  }
  switch(BVar12) {
  case BROTLI_STATE_CONTEXT_MAP_NONE:
    BVar3 = DecodeVarLenUint8(s,&s->br,num_htrees);
    if (BVar3 != BROTLI_DECODER_SUCCESS) {
      return BVar3;
    }
    *num_htrees = *num_htrees + 1;
    (s->arena).header.context_index = 0;
    puVar5 = (uint8_t *)(*s->alloc_func)(s->memory_manager_opaque,context_map_size);
    *context_map_arg = puVar5;
    if (puVar5 == (uint8_t *)0x0) {
      return BROTLI_DECODER_ERROR_ALLOC_CONTEXT_MAP;
    }
    if (*num_htrees < 2) {
      memset(puVar5,0,context_map_size);
      return BROTLI_DECODER_SUCCESS;
    }
    (s->arena).header.substate_context_map = BROTLI_STATE_CONTEXT_MAP_READ_PREFIX;
  case BROTLI_STATE_CONTEXT_MAP_READ_PREFIX:
    uVar6 = (s->br).bit_pos_;
    uVar7 = uVar6 | 8;
    while (uVar6 < 5) {
      pbVar2 = (s->br).next_in;
      if (pbVar2 == (s->br).last_in) {
        return BROTLI_DECODER_NEEDS_MORE_INPUT;
      }
      (s->br).val_ = (s->br).val_ | (ulong)*pbVar2 << ((byte)uVar6 & 0x3f);
      (s->br).bit_pos_ = uVar7;
      (s->br).next_in = pbVar2 + 1;
      uVar6 = uVar7;
    }
    uVar7 = (s->br).val_;
    uVar11 = (uint64_t)(-((uint)uVar7 & 1) & ((uint)(uVar7 >> 1) & 0xf) + 1);
    (s->arena).header.max_run_length_prefix = uVar11;
    (s->br).bit_pos_ = uVar6 + (-(ulong)((uVar7 & 1) == 0) | 0xfffffffffffffffb);
    (s->br).val_ = uVar7 >> ((byte)uVar7 & 1) * '\x04' + 1;
    (s->arena).header.substate_context_map = BROTLI_STATE_CONTEXT_MAP_HUFFMAN;
    break;
  case BROTLI_STATE_CONTEXT_MAP_HUFFMAN:
    uVar11 = (s->arena).header.max_run_length_prefix;
    break;
  case BROTLI_STATE_CONTEXT_MAP_DECODE:
    code = (s->arena).header.code;
    goto LAB_00368724;
  case BROTLI_STATE_CONTEXT_MAP_TRANSFORM:
    goto switchD_003685dd_caseD_4;
  }
  BVar3 = ReadHuffmanCode(uVar11 + *num_htrees,uVar11 + *num_htrees,
                          (s->arena).header.context_map_table,(uint64_t *)0x0,s);
  if (BVar3 == BROTLI_DECODER_SUCCESS) {
    (s->arena).header.code = 0xffff;
    (s->arena).header.substate_context_map = BROTLI_STATE_CONTEXT_MAP_DECODE;
    code = 0xffff;
LAB_00368724:
    uVar6 = (s->arena).header.max_run_length_prefix;
    puVar5 = *context_map_arg;
    bVar14 = code != 0xffff;
    local_48 = (s->arena).header.context_map_table;
    br = &s->br;
    uVar11 = (s->arena).header.context_index;
    uVar13 = code;
    local_40 = context_map_arg;
    while (context_map_arg = local_40, uVar11 < context_map_size || bVar14) {
      uVar7 = (s->br).bit_pos_;
      if (bVar14) {
LAB_00368871:
        while (uVar7 < uVar13) {
          pbVar2 = (s->br).next_in;
          if (pbVar2 == (s->br).last_in) {
LAB_00368996:
            (s->arena).header.code = uVar13;
            (s->arena).header.context_index = uVar11;
            return BROTLI_DECODER_NEEDS_MORE_INPUT;
          }
          (s->br).val_ = (s->br).val_ | (ulong)*pbVar2 << ((byte)uVar7 & 0x3f);
          uVar7 = uVar7 + 8;
          (s->br).bit_pos_ = uVar7;
          (s->br).next_in = pbVar2 + 1;
        }
        uVar1 = (s->br).val_;
        uVar9 = *(ulong *)(kBrotliBitMask + uVar13 * 8);
        (s->br).bit_pos_ = uVar7 - uVar13;
        (s->br).val_ = uVar1 >> ((byte)uVar13 & 0x3f);
        __n = (ulong)(uint)(1 << ((byte)uVar13 & 0x1f)) + (uVar9 & uVar1);
        uVar7 = __n + uVar11;
        if (context_map_size < uVar7) {
          return BROTLI_DECODER_ERROR_FORMAT_CONTEXT_MAP_REPEAT;
        }
        bVar14 = false;
        local_38 = br;
        memset(puVar5 + uVar11,0,__n);
        br = local_38;
        uVar11 = uVar7;
      }
      else {
        while (uVar7 < 0xf) {
          pbVar2 = (s->br).next_in;
          if (pbVar2 == (s->br).last_in) {
            iVar4 = SafeDecodeSymbol(local_48,br,&code);
            if (iVar4 != 0) goto LAB_00368835;
            uVar13 = 0xffff;
            goto LAB_00368996;
          }
          (s->br).val_ = (s->br).val_ | (ulong)*pbVar2 << ((byte)uVar7 & 0x3f);
          uVar7 = uVar7 + 8;
          (s->br).bit_pos_ = uVar7;
          (s->br).next_in = pbVar2 + 1;
        }
        uVar1 = br->val_;
        pHVar10 = local_48 + (uVar1 & 0xff);
        uVar8 = (ulong)pHVar10->bits;
        uVar9 = uVar1;
        if (8 < uVar8) {
          uVar7 = uVar7 - 8;
          uVar9 = uVar1 >> 8;
          pHVar10 = pHVar10 + (ulong)(*(uint *)(kBrotliBitMask + (ulong)(pHVar10->bits - 8) * 8) &
                                      (uint)(uVar1 >> 8) & 0x7f) + (ulong)pHVar10->value;
          uVar8 = (ulong)pHVar10->bits;
        }
        (s->br).bit_pos_ = uVar7 - uVar8;
        (s->br).val_ = uVar9 >> ((byte)uVar8 & 0x3f);
        code = (uint64_t)pHVar10->value;
LAB_00368835:
        if (code == 0) {
          puVar5[uVar11] = '\0';
          uVar11 = uVar11 + 1;
          uVar13 = 0;
          bVar14 = false;
        }
        else {
          uVar13 = code;
          if (code <= uVar6) {
            uVar7 = (s->br).bit_pos_;
            goto LAB_00368871;
          }
          puVar5[uVar11] = (char)code - (char)uVar6;
          bVar14 = false;
          uVar11 = uVar11 + 1;
        }
      }
    }
switchD_003685dd_caseD_4:
    BVar3 = BROTLI_DECODER_SUCCESS;
    BVar12 = BROTLI_STATE_CONTEXT_MAP_TRANSFORM;
    uVar11 = (s->br).bit_pos_;
    while (uVar11 == 0) {
      pbVar2 = (s->br).next_in;
      if (pbVar2 == (s->br).last_in) {
        BVar3 = BROTLI_DECODER_NEEDS_MORE_INPUT;
        goto LAB_00368980;
      }
      (s->br).val_ = (s->br).val_ | (ulong)*pbVar2;
      (s->br).bit_pos_ = 8;
      (s->br).next_in = pbVar2 + 1;
      uVar11 = 8;
    }
    uVar6 = (s->br).val_;
    (s->br).bit_pos_ = uVar11 - 1;
    (s->br).val_ = uVar6 >> 1;
    BVar12 = BROTLI_STATE_CONTEXT_MAP_NONE;
    if ((uVar6 & 1) != 0) {
      InverseMoveToFrontTransform(*context_map_arg,context_map_size,s);
    }
LAB_00368980:
    (s->arena).header.substate_context_map = BVar12;
  }
  return BVar3;
}

Assistant:

static BrotliDecoderErrorCode DecodeContextMap(brotli_reg_t context_map_size, brotli_reg_t *num_htrees,
                                               uint8_t **context_map_arg, BrotliDecoderState *s) {
	BrotliBitReader *br = &s->br;
	BrotliDecoderErrorCode result = BROTLI_DECODER_SUCCESS;
	BrotliMetablockHeaderArena *h = &s->arena.header;

	switch ((int)h->substate_context_map) {
	case BROTLI_STATE_CONTEXT_MAP_NONE:
		result = DecodeVarLenUint8(s, br, num_htrees);
		if (result != BROTLI_DECODER_SUCCESS) {
			return result;
		}
		(*num_htrees)++;
		h->context_index = 0;
		BROTLI_LOG_UINT(context_map_size);
		BROTLI_LOG_UINT(*num_htrees);
		*context_map_arg = (uint8_t *)BROTLI_DECODER_ALLOC(s, (size_t)context_map_size);
		if (*context_map_arg == 0) {
			return BROTLI_FAILURE(BROTLI_DECODER_ERROR_ALLOC_CONTEXT_MAP);
		}
		if (*num_htrees <= 1) {
			memset(*context_map_arg, 0, (size_t)context_map_size);
			return BROTLI_DECODER_SUCCESS;
		}
		h->substate_context_map = BROTLI_STATE_CONTEXT_MAP_READ_PREFIX;
		/* Fall through. */

	case BROTLI_STATE_CONTEXT_MAP_READ_PREFIX: {
		brotli_reg_t bits;
		/* In next stage ReadHuffmanCode uses at least 4 bits, so it is safe
		   to peek 4 bits ahead. */
		if (!BrotliSafeGetBits(br, 5, &bits)) {
			return BROTLI_DECODER_NEEDS_MORE_INPUT;
		}
		if ((bits & 1) != 0) { /* Use RLE for zeros. */
			h->max_run_length_prefix = (bits >> 1) + 1;
			BrotliDropBits(br, 5);
		} else {
			h->max_run_length_prefix = 0;
			BrotliDropBits(br, 1);
		}
		BROTLI_LOG_UINT(h->max_run_length_prefix);
		h->substate_context_map = BROTLI_STATE_CONTEXT_MAP_HUFFMAN;
	}
		/* Fall through. */

	case BROTLI_STATE_CONTEXT_MAP_HUFFMAN: {
		brotli_reg_t alphabet_size = *num_htrees + h->max_run_length_prefix;
		result = ReadHuffmanCode(alphabet_size, alphabet_size, h->context_map_table, NULL, s);
		if (result != BROTLI_DECODER_SUCCESS)
			return result;
		h->code = 0xFFFF;
		h->substate_context_map = BROTLI_STATE_CONTEXT_MAP_DECODE;
	}
		/* Fall through. */

	case BROTLI_STATE_CONTEXT_MAP_DECODE: {
		brotli_reg_t context_index = h->context_index;
		brotli_reg_t max_run_length_prefix = h->max_run_length_prefix;
		uint8_t *context_map = *context_map_arg;
		brotli_reg_t code = h->code;
		BROTLI_BOOL skip_preamble = (code != 0xFFFF);
		while (context_index < context_map_size || skip_preamble) {
			if (!skip_preamble) {
				if (!SafeReadSymbol(h->context_map_table, br, &code)) {
					h->code = 0xFFFF;
					h->context_index = context_index;
					return BROTLI_DECODER_NEEDS_MORE_INPUT;
				}
				BROTLI_LOG_UINT(code);

				if (code == 0) {
					context_map[context_index++] = 0;
					continue;
				}
				if (code > max_run_length_prefix) {
					context_map[context_index++] = (uint8_t)(code - max_run_length_prefix);
					continue;
				}
			} else {
				skip_preamble = BROTLI_FALSE;
			}
			/* RLE sub-stage. */
			{
				brotli_reg_t reps;
				if (!BrotliSafeReadBits(br, code, &reps)) {
					h->code = code;
					h->context_index = context_index;
					return BROTLI_DECODER_NEEDS_MORE_INPUT;
				}
				reps += 1U << code;
				BROTLI_LOG_UINT(reps);
				if (context_index + reps > context_map_size) {
					return BROTLI_FAILURE(BROTLI_DECODER_ERROR_FORMAT_CONTEXT_MAP_REPEAT);
				}
				do {
					context_map[context_index++] = 0;
				} while (--reps);
			}
		}
	}
		/* Fall through. */

	case BROTLI_STATE_CONTEXT_MAP_TRANSFORM: {
		brotli_reg_t bits;
		if (!BrotliSafeReadBits(br, 1, &bits)) {
			h->substate_context_map = BROTLI_STATE_CONTEXT_MAP_TRANSFORM;
			return BROTLI_DECODER_NEEDS_MORE_INPUT;
		}
		if (bits != 0) {
			InverseMoveToFrontTransform(*context_map_arg, context_map_size, s);
		}
		h->substate_context_map = BROTLI_STATE_CONTEXT_MAP_NONE;
		return BROTLI_DECODER_SUCCESS;
	}

	default:
		return BROTLI_FAILURE(BROTLI_DECODER_ERROR_UNREACHABLE); /* COV_NF_LINE */
	}
}